

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3DecOrHexToI64(char *z,i64 *pOut)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  byte *pbVar7;
  ulong uVar8;
  
  if ((*z == '0') && ((byte)(z[1] | 0x20U) == 0x78)) {
    pbVar2 = (byte *)(z + 2);
    do {
      pbVar7 = pbVar2;
      bVar1 = *pbVar7;
      pbVar2 = pbVar7 + 1;
    } while (bVar1 == 0x30);
    lVar6 = 0;
    uVar8 = 0;
    while ((""[bVar1] & 8) != 0) {
      uVar8 = uVar8 << 4 | (ulong)(((char)(bVar1 * '\x02') >> 7 & 9U) + bVar1 & 0xf);
      bVar1 = (pbVar7 + 1)[lVar6];
      lVar6 = lVar6 + 1;
    }
    *pOut = uVar8;
    if ((int)lVar6 < 0x11) {
      uVar3 = (uint)(pbVar7[lVar6] != 0);
    }
    else {
      uVar3 = 2;
    }
    return uVar3;
  }
  sVar5 = strspn(z,"+- \n\t0123456789");
  uVar3 = (uint)sVar5 & 0x3fffffff;
  iVar4 = sqlite3Atoi64(z,pOut,(uVar3 + 1) - (uint)(z[uVar3] == '\0'),'\x01');
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3DecOrHexToI64(const char *z, i64 *pOut){
#ifndef SQLITE_OMIT_HEX_INTEGER
  if( z[0]=='0'
   && (z[1]=='x' || z[1]=='X')
  ){
    u64 u = 0;
    int i, k;
    for(i=2; z[i]=='0'; i++){}
    for(k=i; sqlite3Isxdigit(z[k]); k++){
      u = u*16 + sqlite3HexToInt(z[k]);
    }
    memcpy(pOut, &u, 8);
    if( k-i>16 ) return 2;
    if( z[k]!=0 ) return 1;
    return 0;
  }else
#endif /* SQLITE_OMIT_HEX_INTEGER */
  {
    int n = (int)(0x3fffffff&strspn(z,"+- \n\t0123456789"));
    if( z[n] ) n++;
    return sqlite3Atoi64(z, pOut, n, SQLITE_UTF8);
  }
}